

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idw.cc
# Opt level: O3

IDWNode * __thiscall gmath::IDWNode::add(IDWNode *this,uint _x,uint _y,float _f,float _w)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  IDWNode *pIVar8;
  ulong uVar9;
  byte bVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  while( true ) {
    uVar3 = this->x;
    uVar4 = this->s;
    if ((_x < uVar4 + uVar3 && uVar3 <= _x) &&
       (uVar13 = this->y, _y < uVar13 + uVar4 && uVar13 <= _y)) break;
    uVar13 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar13 == 0; uVar13 = uVar13 - 1) {
      }
    }
    uVar13 = -(uint)(uVar4 == 0) | uVar13;
    uVar4 = this->y;
    do {
      do {
        uVar13 = uVar13 + 1;
        bVar10 = (byte)uVar13;
        uVar6 = uVar3 >> (bVar10 & 0x1f);
      } while (_x < uVar6 << (bVar10 & 0x1f));
    } while (((uVar6 + 1 << (bVar10 & 0x1f) <= _x) ||
             (uVar6 = uVar4 >> (bVar10 & 0x1f), _y < uVar6 << (bVar10 & 0x1f))) ||
            (uVar6 + 1 << (bVar10 & 0x1f) <= _y));
    pIVar8 = (IDWNode *)operator_new(0x48);
    uVar13 = -1 << (bVar10 & 0x1f);
    IDWNode(pIVar8,uVar3 & uVar13,uVar4 & uVar13,1 << (bVar10 & 0x1f),this);
    this = pIVar8;
  }
  if (uVar4 < 2) {
    this->f = _f;
    this->w = _w;
  }
  else {
    uVar9 = (ulong)((uint)(uVar13 + (uVar4 >> 1) <= _y) * 2);
    uVar12 = uVar9 + 1;
    if (_x < uVar3 + (uVar4 >> 1)) {
      uVar12 = uVar9;
    }
    if (this->child[uVar12] == (IDWNode *)0x0) {
      pIVar8 = (IDWNode *)operator_new(0x48);
      IDWNode(pIVar8,_x,_y,_f,_w);
    }
    else {
      pIVar8 = add(this->child[uVar12],_x,_y,_f,_w);
    }
    this->child[uVar12] = pIVar8;
    this->n = 0;
    this->f = 0.0;
    this->w = 0.0;
    fVar14 = 0.0;
    fVar15 = 0.0;
    iVar7 = 0;
    lVar11 = 0;
    do {
      pIVar8 = this->child[lVar11];
      if (pIVar8 != (IDWNode *)0x0) {
        iVar5 = pIVar8->n;
        iVar7 = iVar7 + iVar5;
        this->n = iVar7;
        fVar16 = (float)iVar5;
        uVar1 = pIVar8->f;
        uVar2 = pIVar8->w;
        fVar14 = fVar14 + fVar16 * (float)uVar1;
        fVar15 = fVar15 + fVar16 * (float)uVar2;
        this->f = fVar14;
        this->w = fVar15;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    this->f = fVar14 * (1.0 / (float)iVar7);
    this->w = fVar15 * (1.0 / (float)iVar7);
  }
  return this;
}

Assistant:

IDWNode *IDWNode::add(unsigned int _x, unsigned int _y, float _f, float _w)
{
  IDWNode *ret=this;

  // is value covered by this node?

  if (_x >= x && _x < x+s && _y >= y && _y < y+s)
  {
    if (s > 1)
    {
      // check into which child node the data point falls

      int i;
      if (_x < x+(s>>1))
      {
        i=2;
        if (_y < y+(s>>1))
        {
          i=0;
        }
      }
      else
      {
        i=3;
        if (_y < y+(s>>1))
        {
          i=1;
        }
      }

      // add to child node

      if (child[i] != 0)
      {
        child[i]=child[i]->add(_x, _y, _f, _w);
      }
      else
      {
        child[i]=new IDWNode(_x, _y, _f, _w);
      }

      // recalculate data of this node

      n=0;
      f=0;
      w=0;

      for (i=0; i<4; i++)
      {
        if (child[i] != 0)
        {
          const int cn=child[i]->n;

          n+=cn;
          f+=cn*child[i]->f;
          w+=cn*child[i]->w;
        }
      }

      const float scale=1.0f/n;

      f*=scale;
      w*=scale;
    }
    else
    {
      // replace data of node with given data

      f=_f;
      w=_w;
    }
  }
  else
  {
    // compute size of parent node that covers existing and new data

    int i=-1;
    unsigned int k=s;
    while (k > 0)
    {
      k>>=1;
      i++;
    }

    i++;
    while (_x < (x>>i)<<i || _x >= ((x>>i)+1)<<i || _y < (y>>i)<<i || _y >= ((y>>i)+1)<<i)
      i++;

    // create parent node

    ret=new IDWNode((x>>i)<<i, (y>>i)<<i, 1<<i, this);

    // add new data value

    ret=ret->add(_x, _y, _f, _w);
  }

  return ret;
}